

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O0

HMAC_context * Curl_HMAC_init(HMAC_params *hashparams,uchar *key,uint keylen)

{
  byte local_41;
  byte *pbStack_40;
  uchar b;
  uchar *hkey;
  HMAC_context *ctxt;
  size_t i;
  byte *pbStack_20;
  uint keylen_local;
  uchar *key_local;
  HMAC_params *hashparams_local;
  
  ctxt = (HMAC_context *)
         ((ulong)(hashparams->hmac_ctxtsize << 1) + 0x18 + (ulong)hashparams->hmac_resultlen);
  i._4_4_ = keylen;
  pbStack_20 = key;
  key_local = (uchar *)hashparams;
  hkey = (uchar *)(*Curl_cmalloc)((size_t)ctxt);
  hashparams_local = (HMAC_params *)hkey;
  if ((HMAC_params *)hkey != (HMAC_params *)0x0) {
    ((HMAC_params *)hkey)->hmac_hinit = (HMAC_hinit_func)key_local;
    ((HMAC_params *)hkey)->hmac_hupdate = (HMAC_hupdate_func)&((HMAC_params *)hkey)->hmac_ctxtsize;
    ((HMAC_params *)hkey)->hmac_hfinal =
         (HMAC_hfinal_func)(((HMAC_params *)hkey)->hmac_hupdate + *(uint *)(key_local + 0x18));
    if (*(uint *)(key_local + 0x1c) < i._4_4_) {
      (**(code **)key_local)(((HMAC_params *)hkey)->hmac_hupdate);
      (**(code **)(key_local + 8))(*(undefined8 *)(hkey + 8),pbStack_20,i._4_4_);
      pbStack_40 = (byte *)(*(long *)(hkey + 0x10) + (ulong)*(uint *)(key_local + 0x18));
      (**(code **)(key_local + 0x10))(pbStack_40,*(undefined8 *)(hkey + 8));
      pbStack_20 = pbStack_40;
      i._4_4_ = *(uint *)(key_local + 0x20);
    }
    (**(code **)key_local)(*(undefined8 *)(hkey + 8));
    (**(code **)key_local)(*(undefined8 *)(hkey + 0x10));
    for (ctxt = (HMAC_context *)0x0; ctxt < (HMAC_context *)(ulong)i._4_4_;
        ctxt = (HMAC_context *)((long)&ctxt->hmac_hash + 1)) {
      local_41 = *pbStack_20 ^ 0x36;
      (**(code **)(key_local + 8))(*(undefined8 *)(hkey + 8),&local_41,1);
      local_41 = *pbStack_20 ^ 0x5c;
      pbStack_20 = pbStack_20 + 1;
      (**(code **)(key_local + 8))(*(undefined8 *)(hkey + 0x10),&local_41,1);
    }
    for (; ctxt < (HMAC_context *)(ulong)*(uint *)(key_local + 0x1c);
        ctxt = (HMAC_context *)((long)&ctxt->hmac_hash + 1)) {
      (**(code **)(key_local + 8))(*(undefined8 *)(hkey + 8),&hmac_ipad,1);
      (**(code **)(key_local + 8))(*(undefined8 *)(hkey + 0x10),&hmac_opad,1);
    }
    hashparams_local = (HMAC_params *)hkey;
  }
  return (HMAC_context *)hashparams_local;
}

Assistant:

struct HMAC_context *
Curl_HMAC_init(const struct HMAC_params *hashparams,
               const unsigned char *key,
               unsigned int keylen)
{
  size_t i;
  struct HMAC_context *ctxt;
  unsigned char *hkey;
  unsigned char b;

  /* Create HMAC context. */
  i = sizeof(*ctxt) + 2 * hashparams->hmac_ctxtsize +
    hashparams->hmac_resultlen;
  ctxt = malloc(i);

  if(!ctxt)
    return ctxt;

  ctxt->hmac_hash = hashparams;
  ctxt->hmac_hashctxt1 = (void *) (ctxt + 1);
  ctxt->hmac_hashctxt2 = (void *) ((char *) ctxt->hmac_hashctxt1 +
      hashparams->hmac_ctxtsize);

  /* If the key is too long, replace it by its hash digest. */
  if(keylen > hashparams->hmac_maxkeylen) {
    (*hashparams->hmac_hinit)(ctxt->hmac_hashctxt1);
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt1, key, keylen);
    hkey = (unsigned char *) ctxt->hmac_hashctxt2 + hashparams->hmac_ctxtsize;
    (*hashparams->hmac_hfinal)(hkey, ctxt->hmac_hashctxt1);
    key = hkey;
    keylen = hashparams->hmac_resultlen;
  }

  /* Prime the two hash contexts with the modified key. */
  (*hashparams->hmac_hinit)(ctxt->hmac_hashctxt1);
  (*hashparams->hmac_hinit)(ctxt->hmac_hashctxt2);

  for(i = 0; i < keylen; i++) {
    b = (unsigned char)(*key ^ hmac_ipad);
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt1, &b, 1);
    b = (unsigned char)(*key++ ^ hmac_opad);
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt2, &b, 1);
  }

  for(; i < hashparams->hmac_maxkeylen; i++) {
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt1, &hmac_ipad, 1);
    (*hashparams->hmac_hupdate)(ctxt->hmac_hashctxt2, &hmac_opad, 1);
  }

  /* Done, return pointer to HMAC context. */
  return ctxt;
}